

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * prvTidyCloneNode(TidyDocImpl *doc,Node *element)

{
  Lexer *lexer_00;
  Node *pNVar1;
  tmbstr ptVar2;
  AttVal *pAVar3;
  Node *node;
  Lexer *lexer;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  pNVar1 = prvTidyNewNode(lexer_00->allocator,lexer_00);
  pNVar1->start = lexer_00->lexsize;
  pNVar1->end = lexer_00->lexsize;
  if (element != (Node *)0x0) {
    pNVar1->parent = element->parent;
    pNVar1->type = element->type;
    pNVar1->closed = element->closed;
    pNVar1->implicit = element->implicit;
    pNVar1->tag = element->tag;
    ptVar2 = prvTidytmbstrdup(doc->allocator,element->element);
    pNVar1->element = ptVar2;
    pAVar3 = prvTidyDupAttrs(doc,element->attributes);
    pNVar1->attributes = pAVar3;
  }
  return pNVar1;
}

Assistant:

Node *TY_(CloneNode)( TidyDocImpl* doc, Node *element )
{
    Lexer* lexer = doc->lexer;
    Node *node = TY_(NewNode)( lexer->allocator, lexer );

    node->start = lexer->lexsize;
    node->end   = lexer->lexsize;

    if ( element )
    {
        node->parent     = element->parent;
        node->type       = element->type;
        node->closed     = element->closed;
        node->implicit   = element->implicit;
        node->tag        = element->tag;
        node->element    = TY_(tmbstrdup)( doc->allocator, element->element );
        node->attributes = TY_(DupAttrs)( doc, element->attributes );
    }
    return node;
}